

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_ecb_encrypt(aes_context *ctx,uint8_t *input,uint8_t *output)

{
  int iVar1;
  uint8_t *output_local;
  uint8_t *input_local;
  aes_context *ctx_local;
  
  iVar1 = aes_supported_x86();
  if (iVar1 == 0) {
    aes_encrypt(ctx,input,output);
  }
  else {
    aes_ecb_encrypt_x86(ctx,input,output);
  }
  return;
}

Assistant:

void aes_ecb_encrypt(const aes_context* ctx, const uint8_t* input, uint8_t* output)
{
#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_ecb_encrypt_x86(ctx, input, output);
        return;
    }
#endif
    aes_encrypt(ctx, input, output);
}